

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O0

void __thiscall AAmbientSound::SetTicker(AAmbientSound *this,FAmbientSound *ambient)

{
  int iVar1;
  FAmbientSound *ambient_local;
  AAmbientSound *this_local;
  
  if ((ambient->type & 3) == 3) {
    this->NextCheck = this->NextCheck + 1;
  }
  else if ((ambient->type & 1) == 0) {
    this->NextCheck = ambient->periodmin + this->NextCheck;
  }
  else {
    iVar1 = rand();
    this->NextCheck =
         (int)(((float)iVar1 / 2.1474836e+09) * (float)(ambient->periodmax - ambient->periodmin)) +
         ambient->periodmin + this->NextCheck;
  }
  return;
}

Assistant:

void AAmbientSound::SetTicker (struct FAmbientSound *ambient)
{
	if ((ambient->type & CONTINUOUS) == CONTINUOUS)
	{
		NextCheck += 1;
	}
	else if (ambient->type & RANDOM)
	{
		NextCheck += (int)(((float)rand() / (float)RAND_MAX) *
				(float)(ambient->periodmax - ambient->periodmin)) +
				ambient->periodmin;
	}
	else
	{
		NextCheck += ambient->periodmin;
	}
}